

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O0

Abc_Nam_t * Abc_NtkNameMan(Abc_Ntk_t *p,int fOuts)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  Abc_Nam_t *pStrsCi;
  int i_1;
  Abc_Obj_t *pObj_1;
  Abc_Nam_t *pStrsCo;
  int i;
  Abc_Obj_t *pObj;
  int fOuts_local;
  Abc_Ntk_t *p_local;
  
  if (fOuts == 0) {
    iVar1 = Abc_NtkCiNum(p);
    p_local = (Abc_Ntk_t *)Abc_NamStart(iVar1,0x18);
    for (pStrsCi._4_4_ = 0; iVar1 = Abc_NtkCiNum(p), pStrsCi._4_4_ < iVar1;
        pStrsCi._4_4_ = pStrsCi._4_4_ + 1) {
      pAVar2 = Abc_NtkCi(p,pStrsCi._4_4_);
      pcVar3 = Abc_ObjName(pAVar2);
      Abc_NamStrFindOrAdd((Abc_Nam_t *)p_local,pcVar3,(int *)0x0);
    }
    iVar1 = Abc_NamObjNumMax((Abc_Nam_t *)p_local);
    if (iVar1 != pStrsCi._4_4_ + 1) {
      __assert_fail("Abc_NamObjNumMax(pStrsCi) == i + 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                    ,0x180,"Abc_Nam_t *Abc_NtkNameMan(Abc_Ntk_t *, int)");
    }
  }
  else {
    iVar1 = Abc_NtkCoNum(p);
    p_local = (Abc_Ntk_t *)Abc_NamStart(iVar1,0x18);
    for (pStrsCo._4_4_ = 0; iVar1 = Abc_NtkCoNum(p), pStrsCo._4_4_ < iVar1;
        pStrsCo._4_4_ = pStrsCo._4_4_ + 1) {
      pAVar2 = Abc_NtkCo(p,pStrsCo._4_4_);
      pcVar3 = Abc_ObjName(pAVar2);
      Abc_NamStrFindOrAdd((Abc_Nam_t *)p_local,pcVar3,(int *)0x0);
    }
    iVar1 = Abc_NamObjNumMax((Abc_Nam_t *)p_local);
    if (iVar1 != pStrsCo._4_4_ + 1) {
      __assert_fail("Abc_NamObjNumMax(pStrsCo) == i + 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                    ,0x177,"Abc_Nam_t *Abc_NtkNameMan(Abc_Ntk_t *, int)");
    }
  }
  return (Abc_Nam_t *)p_local;
}

Assistant:

Abc_Nam_t * Abc_NtkNameMan( Abc_Ntk_t * p, int fOuts )
{
    if ( fOuts )
    {
        Abc_Obj_t * pObj;  int i;
        Abc_Nam_t * pStrsCo = Abc_NamStart( Abc_NtkCoNum(p), 24 );
        Abc_NtkForEachCo( p, pObj, i )
            Abc_NamStrFindOrAdd( pStrsCo, Abc_ObjName(pObj), NULL );
        assert( Abc_NamObjNumMax(pStrsCo) == i + 1 );
        return pStrsCo;
    }
    else
    {
        Abc_Obj_t * pObj;  int i;
        Abc_Nam_t * pStrsCi = Abc_NamStart( Abc_NtkCiNum(p), 24 );
        Abc_NtkForEachCi( p, pObj, i )
            Abc_NamStrFindOrAdd( pStrsCi, Abc_ObjName(pObj), NULL );
        assert( Abc_NamObjNumMax(pStrsCi) == i + 1 );
        return pStrsCi;
   }
}